

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O2

void __thiscall TTD::FileWriter::WriteRawByteBuff_Fixed<unsigned_int>(FileWriter *this,uint *data)

{
  byte *dst;
  
  dst = ReserveSpaceForSmallData<4ul>(this);
  js_memcpy_s(dst,4,data,4);
  CommitSpaceForSmallData(this,4);
  return;
}

Assistant:

void WriteRawByteBuff_Fixed(const T& data)
        {
            byte* trgt = this->ReserveSpaceForSmallData<sizeof(T)>();

            js_memcpy_s(trgt, sizeof(T), (const byte*)(&data), sizeof(T));

            this->CommitSpaceForSmallData(sizeof(T));
        }